

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_disableEnable_Test::~TEST_MockCallTest_disableEnable_Test
          (TEST_MockCallTest_disableEnable_Test *this)

{
  TEST_MockCallTest_disableEnable_Test *this_local;
  
  ~TEST_MockCallTest_disableEnable_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockCallTest, disableEnable)
{
    mock().disable();
    mock().expectOneCall("function");
    mock().actualCall("differenFunction");
    CHECK(! mock().expectedCallsLeft());
    mock().enable();
    mock().expectOneCall("function");
    CHECK(mock().expectedCallsLeft());
    mock().actualCall("function");

    mock().checkExpectations();
}